

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

void P_AutoUseHealth(player_t *player,int saveHealth)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TArray<AInventory_*,_AInventory_*> *this;
  int saveHealth_local;
  AInventory *local_60;
  TArray<AInventory_*,_AInventory_*> LargeHealthItems;
  TArray<AInventory_*,_AInventory_*> NormalHealthItems;
  
  NormalHealthItems.Array = (AInventory **)0x0;
  NormalHealthItems.Most = 0;
  NormalHealthItems.Count = 0;
  LargeHealthItems.Array = (AInventory **)0x0;
  LargeHealthItems.Most = 0;
  LargeHealthItems.Count = 0;
  saveHealth_local = saveHealth;
  local_60 = GC::ReadBarrier<AInventory>((AInventory **)&(player->mo->super_AActor).Inventory);
  for (; local_60 != (AInventory *)0x0;
      local_60 = GC::ReadBarrier<AInventory>((AInventory **)&(local_60->super_AActor).Inventory)) {
    if (((0 < local_60->Amount) &&
        (bVar1 = DObject::IsKindOf((DObject *)local_60,AHealthPickup::RegistrationInfo.MyClass),
        bVar1)) &&
       ((this = &LargeHealthItems, *(int *)&local_60->field_0x4fc == 2 ||
        (this = &NormalHealthItems, *(int *)&local_60->field_0x4fc == 1)))) {
      TArray<AInventory_*,_AInventory_*>::Push(this,&local_60);
    }
  }
  iVar2 = CountHealth(&NormalHealthItems);
  iVar3 = CountHealth(&LargeHealthItems);
  iVar4 = G_SkillProperty(SKILLP_AutoUseHealth);
  if (iVar2 < saveHealth || iVar4 == 0) {
    if (iVar3 < saveHealth) {
      if (iVar3 + iVar2 < saveHealth || iVar4 == 0) {
        iVar2 = player->health;
        goto LAB_00408119;
      }
      iVar2 = UseHealthItems(&NormalHealthItems,&saveHealth_local);
      iVar2 = iVar2 + player->health;
      player->health = iVar2;
      if (saveHealth_local < 1) goto LAB_00408119;
      iVar2 = UseHealthItems(&LargeHealthItems,&saveHealth_local);
    }
    else {
      iVar2 = UseHealthItems(&LargeHealthItems,&saveHealth_local);
    }
  }
  else {
    iVar2 = UseHealthItems(&NormalHealthItems,&saveHealth_local);
  }
  iVar2 = iVar2 + player->health;
  player->health = iVar2;
LAB_00408119:
  (player->mo->super_AActor).health = iVar2;
  TArray<AInventory_*,_AInventory_*>::~TArray(&LargeHealthItems);
  TArray<AInventory_*,_AInventory_*>::~TArray(&NormalHealthItems);
  return;
}

Assistant:

void P_AutoUseHealth(player_t *player, int saveHealth)
{
	TArray<AInventory *> NormalHealthItems;
	TArray<AInventory *> LargeHealthItems;

	for(AInventory *inv = player->mo->Inventory; inv != NULL; inv = inv->Inventory)
	{
		if (inv->Amount > 0 && inv->IsKindOf(RUNTIME_CLASS(AHealthPickup)))
		{
			int mode = static_cast<AHealthPickup*>(inv)->autousemode;

			if (mode == 1) NormalHealthItems.Push(inv);
			else if (mode == 2) LargeHealthItems.Push(inv);
		}
	}

	int normalhealth = CountHealth(NormalHealthItems);
	int largehealth = CountHealth(LargeHealthItems);

	bool skilluse = !!G_SkillProperty(SKILLP_AutoUseHealth);

	if (skilluse && normalhealth >= saveHealth)
	{ // Use quartz flasks
		player->health += UseHealthItems(NormalHealthItems, saveHealth);
	}
	else if (largehealth >= saveHealth)
	{ 
		// Use mystic urns
		player->health += UseHealthItems(LargeHealthItems, saveHealth);
	}
	else if (skilluse && normalhealth + largehealth >= saveHealth)
	{ // Use mystic urns and quartz flasks
		player->health += UseHealthItems(NormalHealthItems, saveHealth);
		if (saveHealth > 0) player->health += UseHealthItems(LargeHealthItems, saveHealth);
	}
	player->mo->health = player->health;
}